

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.h
# Opt level: O2

bool google::protobuf::compiler::cpp::anon_unknown_0::CanInitializeByZeroing(FieldDescriptor *field)

{
  bool bVar1;
  CppType CVar2;
  EnumValueDescriptor *pEVar3;
  byte bVar4;
  
  if (*(int *)(field + 0x4c) == 3) {
    return false;
  }
  if (field[0x50] != (FieldDescriptor)0x0) {
LAB_00280e58:
    return false;
  }
  CVar2 = FieldDescriptor::cpp_type(field);
  switch(CVar2) {
  case CPPTYPE_INT32:
  case CPPTYPE_UINT32:
    bVar4 = *(int *)(field + 0xa0) == 0;
    break;
  case CPPTYPE_INT64:
  case CPPTYPE_UINT64:
    bVar4 = *(long *)(field + 0xa0) == 0;
    break;
  case CPPTYPE_DOUBLE:
    bVar1 = *(double *)(field + 0xa0) == 0.0;
    goto LAB_00280e4b;
  case CPPTYPE_FLOAT:
    bVar1 = *(float *)(field + 0xa0) == 0.0;
LAB_00280e4b:
    bVar4 = -bVar1 & 1;
    break;
  case CPPTYPE_BOOL:
    bVar4 = (byte)field[0xa0] ^ 1;
    break;
  case CPPTYPE_ENUM:
    pEVar3 = FieldDescriptor::default_value_enum(field);
    bVar4 = *(int *)(pEVar3 + 0x10) == 0;
    break;
  default:
    goto LAB_00280e58;
  }
  return (bool)bVar4;
}

Assistant:

inline bool FieldDescriptor::is_repeated() const {
  return label() == LABEL_REPEATED;
}